

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_stream.cpp
# Opt level: O1

void __thiscall duckdb::MemoryStream::MemoryStream(MemoryStream *this,MemoryStream *other)

{
  idx_t iVar1;
  
  (this->super_WriteStream)._vptr_WriteStream = (_func_int **)&PTR_WriteData_01997240;
  (this->super_ReadStream)._vptr_ReadStream = (_func_int **)&DAT_01997270;
  (this->allocator).ptr = (Allocator *)0x0;
  this->data = other->data;
  this->capacity = other->capacity;
  iVar1 = other->position;
  (this->allocator).ptr = (other->allocator).ptr;
  this->position = iVar1;
  other->capacity = 0;
  other->data = (data_ptr_t)0x0;
  (other->allocator).ptr = (Allocator *)0x0;
  other->position = 0;
  return;
}

Assistant:

MemoryStream::MemoryStream(MemoryStream &&other) noexcept {
	// Move the data from the other stream into this stream
	data = other.data;
	position = other.position;
	capacity = other.capacity;
	allocator = other.allocator;

	// Reset the other stream
	other.data = nullptr;
	other.position = 0;
	other.capacity = 0;
	other.allocator = nullptr;
}